

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# walletdb.cpp
# Opt level: O2

bool wallet::LoadHDChain(CWallet *pwallet,DataStream *ssValue,string *strErr)

{
  LegacyDataSPKM *this;
  long in_FS_OFFSET;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock4;
  CHDChain chain;
  unique_lock<std::recursive_mutex> uStack_68;
  CHDChain local_58;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)&uStack_68,&pwallet->cs_wallet,
             "pwallet->cs_wallet",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/walletdb.cpp"
             ,0x1c2,false);
  CHDChain::CHDChain(&local_58);
  CHDChain::SerializationOps<DataStream,wallet::CHDChain,ActionUnserialize>(&local_58,ssValue);
  this = CWallet::GetOrCreateLegacyDataSPKM(pwallet);
  LegacyDataSPKM::LoadHDChain(this,&local_58);
  std::unique_lock<std::recursive_mutex>::~unique_lock(&uStack_68);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return true;
  }
  __stack_chk_fail();
}

Assistant:

bool LoadHDChain(CWallet* pwallet, DataStream& ssValue, std::string& strErr)
{
    LOCK(pwallet->cs_wallet);
    try {
        CHDChain chain;
        ssValue >> chain;
        pwallet->GetOrCreateLegacyDataSPKM()->LoadHDChain(chain);
    } catch (const std::exception& e) {
        if (strErr.empty()) {
            strErr = e.what();
        }
        return false;
    }
    return true;
}